

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::SweepPendingObjects(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  bool bVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  bVar1 = RecyclerSweep::HasPendingSweepSmallHeapBlocks(recyclerSweep);
  if (bVar1) {
    for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
      HeapBucketGroup<SmallAllocationBlockAttributes>::SweepPendingObjects
                (this->heapBuckets + local_1c,recyclerSweep);
    }
    for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
      HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPendingObjects
                (this->mediumHeapBuckets + local_20,recyclerSweep);
    }
  }
  LargeHeapBucket::SweepPendingObjects(&this->largeObjectBucket,recyclerSweep);
  return;
}

Assistant:

void
HeapInfo::SweepPendingObjects(RecyclerSweep& recyclerSweep)
{
    if (recyclerSweep.HasPendingSweepSmallHeapBlocks())
    {
        for (uint i = 0; i < HeapConstants::BucketCount; i++)
        {
            heapBuckets[i].SweepPendingObjects(recyclerSweep);
        }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
        for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
        {
            mediumHeapBuckets[i].SweepPendingObjects(recyclerSweep);
        }
#endif
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepPendingObjects(recyclerSweep);
    }
#endif

    largeObjectBucket.SweepPendingObjects(recyclerSweep);
}